

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::WatWriter::WriteEndBlock(WatWriter *this)

{
  int iVar1;
  Info local_58;
  
  iVar1 = this->indent_;
  this->indent_ = iVar1 + -2;
  if (1 < iVar1) {
    ModuleContext::EndBlock(&this->super_ModuleContext);
    Opcode::GetInfo(&local_58,(Opcode *)&Opcode::End_Opcode);
    WritePuts(this,local_58.name,Newline);
    return;
  }
  __assert_fail("indent_ >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wat-writer.cc"
                ,0xd1,"void wabt::(anonymous namespace)::WatWriter::Dedent()");
}

Assistant:

void WatWriter::Dedent() {
  indent_ -= INDENT_SIZE;
  assert(indent_ >= 0);
}